

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbString.cpp
# Opt level: O2

CbString * __thiscall
Hpipe::CbString::read_line
          (CbString *__return_storage_ptr__,CbString *this,char sep,bool skip_void_lines)

{
  ulong uVar1;
  Buffer *pBVar2;
  CbString *pCVar3;
  bool bVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  ulong uVar6;
  Buffer *b;
  ulong uVar7;
  PT pcr;
  anon_class_16_2_441e4f48 local_50;
  PT local_40;
  CbString *local_38;
  
  if ((int)CONCAT71(in_register_00000009,skip_void_lines) == 0) {
    uVar5 = this->off;
    uVar6 = this->end;
  }
  else {
    while( true ) {
      uVar5 = this->off;
      uVar6 = this->end;
      if ((uVar6 == uVar5) || ((uint)this->beg->data[uVar5] != (int)sep)) break;
      read_byte(this);
    }
  }
  local_50.pcr = &local_40;
  local_40 = 0;
  local_50.sep = sep;
  local_38 = __return_storage_ptr__;
  if (uVar5 < uVar6) {
    b = this->beg;
    uVar1 = b->used;
    uVar7 = uVar6 - uVar1;
    if (uVar6 < uVar1 || uVar7 == 0) {
LAB_00142b01:
      read_line::anon_class_16_2_441e4f48::operator()(&local_50,b,(uint)uVar5,(uint)uVar6);
    }
    else {
      pBVar2 = b->next;
      bVar4 = read_line::anon_class_16_2_441e4f48::operator()(&local_50,b,(uint)uVar5,(uint)uVar1);
      if (pBVar2 != (Buffer *)0x0 && bVar4) {
        b = pBVar2;
        do {
          uVar5 = b->used;
          uVar6 = uVar7 - uVar5;
          if (uVar7 < uVar5 || uVar6 == 0) {
            uVar5 = 0;
            uVar6 = uVar7 & 0xffffffff;
            goto LAB_00142b01;
          }
          pBVar2 = b->next;
          bVar4 = read_line::anon_class_16_2_441e4f48::operator()(&local_50,b,0,(uint)uVar5);
          if (!bVar4) break;
          uVar5 = pBVar2->used;
          uVar7 = uVar6 - uVar5;
          if (uVar6 < uVar5 || uVar7 == 0) {
            uVar5 = 0;
            uVar6 = uVar6 & 0xffffffff;
            b = pBVar2;
            goto LAB_00142b01;
          }
          b = pBVar2->next;
          bVar4 = read_line::anon_class_16_2_441e4f48::operator()(&local_50,pBVar2,0,(uint)uVar5);
        } while (bVar4);
      }
    }
  }
  pCVar3 = local_38;
  CbString(local_38,this,0,local_40);
  skip_some(this,local_40 + 1);
  return pCVar3;
}

Assistant:

CbString CbString::read_line( char sep, bool skip_void_lines ) {
    if ( skip_void_lines )
        while ( not empty() and *ptr() == sep )
            skip_byte();
    // find sep
    PT pcr = 0;
    visitor( [ &pcr, sep ]( const Buffer *b, unsigned off, unsigned used ) {
        for( unsigned val = off; val < used; ++val ) {
            if ( b->data[ val ] == sep ) {
                pcr += val - off;
                return false;
            }
        }
        pcr += used - off;
        return true;
    } );
    CbString res{ *this, 0, pcr };
    skip_some( pcr + 1 );
    return res;
}